

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

uint aom_obmc_sub_pixel_variance64x16_c
               (uint8_t *pre,int pre_stride,int xoffset,int yoffset,int32_t *wsrc,int32_t *mask,
               uint *sse)

{
  uint uVar1;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  uint8_t *in_RDI;
  uint8_t temp2 [1024];
  uint16_t fdata3 [1088];
  uint8_t local_ca8 [8];
  uint *in_stack_fffffffffffff360;
  int32_t *in_stack_fffffffffffff368;
  int32_t *in_stack_fffffffffffff370;
  int in_stack_fffffffffffff37c;
  uint8_t *in_stack_fffffffffffff380;
  uint16_t local_8a8 [1098];
  int local_14;
  
  local_14 = in_ECX;
  var_filter_block2d_bil_first_pass_c
            (in_RDI,local_8a8,in_ESI,1,0x11,0x40,bilinear_filters_2t[in_EDX]);
  var_filter_block2d_bil_second_pass_c
            (local_8a8,local_ca8,0x40,0x40,0x10,0x40,bilinear_filters_2t[local_14]);
  uVar1 = aom_obmc_variance64x16_c
                    (in_stack_fffffffffffff380,in_stack_fffffffffffff37c,in_stack_fffffffffffff370,
                     in_stack_fffffffffffff368,in_stack_fffffffffffff360);
  return uVar1;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}